

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O0

bool __thiscall Clasp::DefaultUnfoundedCheck::pushTodo(DefaultUnfoundedCheck *this,NodeId at)

{
  reference pAVar1;
  size_type in_ESI;
  uint *in_RDI;
  bool bVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  pAVar1 = bk_lib::
           pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
           ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                         *)(in_RDI + 10),in_ESI);
  bVar2 = ((uint)*pAVar1 >> 0x1d & 1) == 0;
  if (bVar2) {
    PodQueue<unsigned_int>::push
              ((PodQueue<unsigned_int> *)
               (CONCAT44(in_ESI,in_stack_fffffffffffffff0) & 0xffffffff00ffffff),in_RDI);
    pAVar1 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                           *)(in_RDI + 10),in_ESI);
    *pAVar1 = (AtomData)((uint)*pAVar1 & 0xdfffffff | 0x20000000);
  }
  return bVar2;
}

Assistant:

bool pushTodo(NodeId at) { return (atoms_[at].todo == 0 && (todo_.push(at), atoms_[at].todo = 1) != 0); }